

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::AverageTest_8x8_quad<unsigned_char>::TestConstantValue
          (AverageTest_8x8_quad<unsigned_char> *this,uchar value)

{
  AverageTestBase<unsigned_char>::FillConstant(&this->super_AverageTestBase<unsigned_char>,value);
  CheckAverages(this);
  return;
}

Assistant:

void TestConstantValue(Pixel value) {
    FillConstant(value);
    CheckAverages();
  }